

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpost.c
# Opt level: O0

FT_Error load_post_names(TT_Face face)

{
  FT_ULong FVar1;
  FT_ULong post_limit;
  FT_ULong post_len;
  FT_Fixed format;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream stream;
  TT_Face face_local;
  
  pFStack_18 = (face->root).stream;
  stream = (FT_Stream)face;
  format._4_4_ = (*face->goto_table)(face,0x706f7374,pFStack_18,&post_limit);
  if (format._4_4_ == 0) {
    FVar1 = FT_Stream_Pos(pFStack_18);
    post_len = stream[9].pathname.value;
    format._4_4_ = FT_Stream_Skip(pFStack_18,0x20);
    if (format._4_4_ == 0) {
      if (post_len == 0x20000) {
        format._4_4_ = load_format_20((TT_Face)stream,pFStack_18,FVar1 + post_limit);
      }
      else if (post_len == 0x25000) {
        format._4_4_ = load_format_25((TT_Face)stream,pFStack_18,FVar1 + post_limit);
      }
      else {
        format._4_4_ = 3;
      }
      *(undefined1 *)&stream[0xc].memory = 1;
    }
  }
  return format._4_4_;
}

Assistant:

static FT_Error
  load_post_names( TT_Face  face )
  {
    FT_Stream  stream;
    FT_Error   error;
    FT_Fixed   format;
    FT_ULong   post_len;
    FT_ULong   post_limit;


    /* get a stream for the face's resource */
    stream = face->root.stream;

    /* seek to the beginning of the PS names table */
    error = face->goto_table( face, TTAG_post, stream, &post_len );
    if ( error )
      goto Exit;

    post_limit = FT_STREAM_POS() + post_len;

    format = face->postscript.FormatType;

    /* go to beginning of subtable */
    if ( FT_STREAM_SKIP( 32 ) )
      goto Exit;

    /* now read postscript table */
    if ( format == 0x00020000L )
      error = load_format_20( face, stream, post_limit );
    else if ( format == 0x00025000L )
      error = load_format_25( face, stream, post_limit );
    else
      error = FT_THROW( Invalid_File_Format );

    face->postscript_names.loaded = 1;

  Exit:
    return error;
  }